

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePartFunction<duckdb::dtime_tz_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  TemplatedValidityMask<unsigned_long> *this;
  value_type vVar1;
  value_type vVar2;
  long *plVar3;
  UnifiedVectorFormat *count;
  unsigned_long *puVar4;
  ulong uVar5;
  reference vector;
  reference vector_00;
  long lVar6;
  long lVar7;
  UnifiedVectorFormat *pUVar8;
  long lVar9;
  long lVar10;
  UnifiedVectorFormat *pUVar11;
  ulong uVar12;
  idx_t i;
  UnifiedVectorFormat *pUVar13;
  VectorType VVar14;
  ulong uVar15;
  undefined8 *puVar16;
  idx_t i_2;
  undefined8 *puVar17;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar14 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar14);
    plVar3 = *(long **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      lVar6 = BinaryLambdaWrapperWithNulls::
              Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                        (**(undefined8 **)(vector + 0x20),(*(undefined8 **)(vector + 0x20))[1],
                         **(undefined8 **)(vector_00 + 0x20));
      *plVar3 = lVar6;
      return;
    }
  }
  else {
    count = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar6 = *(long *)(vector + 0x20);
      puVar16 = *(undefined8 **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar14);
        lVar9 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),
                   (TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
        if (*(long *)(result + 0x28) == 0) {
          puVar17 = (undefined8 *)(lVar6 + 8);
          for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
            lVar6 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                              (puVar17[-1],*puVar17,*puVar16);
            *(long *)(lVar9 + (long)pUVar13 * 8) = lVar6;
            puVar17 = puVar17 + 2;
          }
          return;
        }
        lVar6 = lVar6 + 8;
        uVar12 = 0;
        pUVar13 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar12 == (ulong)(count + 0x3f) >> 6) {
            return;
          }
          puVar4 = ((TemplatedValidityMask<unsigned_long> *)(result + 0x28))->validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            pUVar8 = pUVar13 + 0x40;
            if (count <= pUVar13 + 0x40) {
              pUVar8 = count;
            }
LAB_006917c6:
            puVar17 = (undefined8 *)((long)pUVar13 * 0x10 + lVar6);
            for (; pUVar11 = pUVar13, pUVar13 < pUVar8; pUVar13 = pUVar13 + 1) {
              lVar7 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                (puVar17[-1],*puVar17,*puVar16);
              *(long *)(lVar9 + (long)pUVar13 * 8) = lVar7;
              puVar17 = puVar17 + 2;
            }
          }
          else {
            uVar5 = puVar4[uVar12];
            pUVar8 = pUVar13 + 0x40;
            if (count <= pUVar13 + 0x40) {
              pUVar8 = count;
            }
            if (uVar5 == 0xffffffffffffffff) goto LAB_006917c6;
            pUVar11 = pUVar8;
            if (uVar5 != 0) {
              puVar17 = (undefined8 *)((long)pUVar13 * 0x10 + lVar6);
              for (uVar15 = 0; pUVar11 = pUVar13 + uVar15, pUVar13 + uVar15 < pUVar8;
                  uVar15 = uVar15 + 1) {
                if ((uVar5 >> (uVar15 & 0x3f) & 1) != 0) {
                  lVar7 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                    (puVar17[-1],*puVar17,*puVar16);
                  *(long *)(lVar9 + (long)pUVar13 * 8 + uVar15 * 8) = lVar7;
                }
                puVar17 = puVar17 + 2;
              }
            }
          }
          uVar12 = uVar12 + 1;
          pUVar13 = pUVar11;
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar6 = *(long *)(vector + 0x20);
          lVar9 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar14);
          lVar7 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          this = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
          FlatVector::VerifyFlatVector(vector);
          TemplatedValidityMask<unsigned_long>::Copy
                    (this,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
          lVar10 = *(long *)(result + 0x28);
          FlatVector::VerifyFlatVector(vector_00);
          if (lVar10 == 0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (this,(TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),(idx_t)count)
            ;
          }
          else {
            duckdb::ValidityMask::Combine((ValidityMask *)this,(ulong)(vector_00 + 0x28));
          }
          if (this->validity_mask == (unsigned_long *)0x0) {
            puVar16 = (undefined8 *)(lVar6 + 8);
            for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
              lVar6 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                (puVar16[-1],*puVar16,*(undefined8 *)(lVar9 + (long)pUVar13 * 8));
              *(long *)(lVar7 + (long)pUVar13 * 8) = lVar6;
              puVar16 = puVar16 + 2;
            }
          }
          else {
            lVar6 = lVar6 + 8;
            pUVar13 = (UnifiedVectorFormat *)0x0;
            for (uVar12 = 0; uVar12 != (ulong)(count + 0x3f) >> 6; uVar12 = uVar12 + 1) {
              if (this->validity_mask == (unsigned_long *)0x0) {
                pUVar8 = pUVar13 + 0x40;
                if (count <= pUVar13 + 0x40) {
                  pUVar8 = count;
                }
LAB_00691ceb:
                puVar16 = (undefined8 *)((long)pUVar13 * 0x10 + lVar6);
                for (; pUVar11 = pUVar13, pUVar13 < pUVar8; pUVar13 = pUVar13 + 1) {
                  lVar10 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                     (puVar16[-1],*puVar16,
                                      *(undefined8 *)(lVar9 + (long)pUVar13 * 8));
                  *(long *)(lVar7 + (long)pUVar13 * 8) = lVar10;
                  puVar16 = puVar16 + 2;
                }
              }
              else {
                uVar5 = this->validity_mask[uVar12];
                pUVar8 = pUVar13 + 0x40;
                if (count <= pUVar13 + 0x40) {
                  pUVar8 = count;
                }
                if (uVar5 == 0xffffffffffffffff) goto LAB_00691ceb;
                pUVar11 = pUVar8;
                if (uVar5 != 0) {
                  puVar16 = (undefined8 *)((long)pUVar13 * 0x10 + lVar6);
                  for (uVar15 = 0; pUVar11 = pUVar13 + uVar15, pUVar13 + uVar15 < pUVar8;
                      uVar15 = uVar15 + 1) {
                    if ((uVar5 >> (uVar15 & 0x3f) & 1) != 0) {
                      lVar10 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                         (puVar16[-1],*puVar16,
                                          *(undefined8 *)(lVar9 + (long)pUVar13 * 8 + uVar15 * 8));
                      *(long *)((long)pUVar13 * 8 + lVar7 + uVar15 * 8) = lVar10;
                    }
                    puVar16 = puVar16 + 2;
                  }
                }
              }
              pUVar13 = pUVar11;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,count);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,count);
          duckdb::Vector::SetVectorType(VVar14);
          lVar6 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
              pUVar8 = pUVar13;
              if (*_ldata != 0) {
                pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar13 * 4);
              }
              pUVar11 = pUVar13;
              if (*local_c0 != 0) {
                pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar13 * 4);
              }
              lVar9 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                (*(undefined8 *)(local_70 + (long)pUVar8 * 0x10),
                                 *(undefined8 *)(local_70 + 8 + (long)pUVar8 * 0x10),
                                 *(undefined8 *)(local_b8 + (long)pUVar11 * 8));
              *(long *)(lVar6 + (long)pUVar13 * 8) = lVar9;
            }
          }
          else {
            for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
              pUVar8 = pUVar13;
              if (*_ldata != 0) {
                pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar13 * 4);
              }
              pUVar11 = pUVar13;
              if (*local_c0 != 0) {
                pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar13 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar8 >> 6) * 8) >> ((ulong)pUVar8 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar11 >> 6) * 8) >> ((ulong)pUVar11 & 0x3f) & 1)
                   != 0)))) {
                lVar9 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                  (*(undefined8 *)(local_70 + (long)pUVar8 * 0x10),
                                   *(undefined8 *)(local_70 + 8 + (long)pUVar8 * 0x10),
                                   *(undefined8 *)(local_b8 + (long)pUVar11 * 8));
                *(long *)(lVar6 + (long)pUVar13 * 8) = lVar9;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar13);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      puVar16 = *(undefined8 **)(vector + 0x20);
      lVar6 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar14);
        lVar9 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),
                   (TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),(idx_t)count);
        if (*(long *)(result + 0x28) == 0) {
          for (pUVar13 = (UnifiedVectorFormat *)0x0; count != pUVar13; pUVar13 = pUVar13 + 1) {
            lVar7 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                              (*puVar16,puVar16[1],*(undefined8 *)(lVar6 + (long)pUVar13 * 8));
            *(long *)(lVar9 + (long)pUVar13 * 8) = lVar7;
          }
          return;
        }
        uVar12 = 0;
        pUVar13 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar12 == (ulong)(count + 0x3f) >> 6) {
            return;
          }
          puVar4 = ((TemplatedValidityMask<unsigned_long> *)(result + 0x28))->validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            pUVar8 = pUVar13 + 0x40;
            if (count <= pUVar13 + 0x40) {
              pUVar8 = count;
            }
LAB_00691a68:
            for (; pUVar11 = pUVar13, pUVar13 < pUVar8; pUVar13 = pUVar13 + 1) {
              lVar7 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                (*puVar16,puVar16[1],*(undefined8 *)(lVar6 + (long)pUVar13 * 8));
              *(long *)(lVar9 + (long)pUVar13 * 8) = lVar7;
            }
          }
          else {
            uVar5 = puVar4[uVar12];
            pUVar8 = pUVar13 + 0x40;
            if (count <= pUVar13 + 0x40) {
              pUVar8 = count;
            }
            if (uVar5 == 0xffffffffffffffff) goto LAB_00691a68;
            pUVar11 = pUVar8;
            if (uVar5 != 0) {
              for (uVar15 = 0; pUVar11 = pUVar13 + uVar15, pUVar13 + uVar15 < pUVar8;
                  uVar15 = uVar15 + 1) {
                if ((uVar5 >> (uVar15 & 0x3f) & 1) != 0) {
                  lVar7 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::dtime_tz_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_tz_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_tz_t,long>
                                    (*puVar16,puVar16[1],
                                     *(undefined8 *)((long)pUVar13 * 8 + lVar6 + uVar15 * 8));
                  *(long *)((long)pUVar13 * 8 + lVar9 + uVar15 * 8) = lVar7;
                }
              }
            }
          }
          uVar12 = uVar12 + 1;
          pUVar13 = pUVar11;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar14);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}